

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic18::Run(UnitTest_semantic18 *this)

{
  Terminator *pTVar1;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_RDI;
  Terminator *i;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string *in_stack_ffffffffffffff18;
  allocator *paVar2;
  FindName *in_stack_ffffffffffffff20;
  allocator local_b9;
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  UnitTestBase *in_stack_ffffffffffffff60;
  FindName *in_stack_ffffffffffffff68;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff70;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"while i == 1 do local i = 1 end",&local_31);
  anon_unknown.dwarf_fc1b::Semantic(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff70,"i",(allocator *)&stack0xffffffffffffff6f);
  FindName::FindName(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pTVar1 = ASTFind<luna::Terminator,FindName>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  FindName::~FindName((FindName *)0x1ab4a5);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  if (pTVar1->scoping_ != LexicalScoping_Global) {
    paVar2 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"\'i->scoping_ == luna::LexicalScoping_Global\'",paVar2);
    UnitTestBase::Error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(in_RDI);
  return;
}

Assistant:

TEST_CASE(semantic18)
{
    auto ast = Semantic("while i == 1 do local i = 1 end");
    auto i = ASTFind<luna::Terminator>(ast, FindName("i"));
    EXPECT_TRUE(i->scoping_ == luna::LexicalScoping_Global);
}